

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_start.cpp
# Opt level: O2

bool __thiscall
FTTYStartupScreen::NetLoop
          (FTTYStartupScreen *this,_func_bool_void_ptr *timer_callback,void *userdata)

{
  bool bVar1;
  uint __i;
  int iVar2;
  long lVar3;
  ssize_t sVar4;
  char k;
  timeval tv;
  fd_set rfds;
  
  do {
    while( true ) {
      do {
        tv.tv_sec = 0;
        tv.tv_usec = 500000;
        for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
          rfds.fds_bits[lVar3] = 0;
        }
        rfds.fds_bits[0]._0_1_ = (byte)rfds.fds_bits[0] | 1;
        iVar2 = select(1,(fd_set *)&rfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
      } while (iVar2 == -1);
      if (iVar2 != 0) break;
      bVar1 = (*timer_callback)(userdata);
      if (bVar1) {
        fputc(10,_stderr);
LAB_002f5ea7:
        return iVar2 == 0;
      }
    }
    sVar4 = read(0,&k,1);
  } while ((sVar4 != 1) || ((k & 0xdfU) != 0x51));
  fwrite("\nNetwork game synchronization aborted.",0x26,1,_stderr);
  goto LAB_002f5ea7;
}

Assistant:

bool FTTYStartupScreen::NetLoop(bool (*timer_callback)(void *), void *userdata)
{
	fd_set rfds;
	struct timeval tv;
	int retval;
	char k;

	for (;;)
	{
		// Don't flood the network with packets on startup.
		tv.tv_sec = 0;
		tv.tv_usec = 500000;

		FD_ZERO (&rfds);
		FD_SET (STDIN_FILENO, &rfds);

		retval = select (1, &rfds, NULL, NULL, &tv);

		if (retval == -1)
		{
			// Error
		}
		else if (retval == 0)
		{
			if (timer_callback (userdata))
			{
				fputc ('\n', stderr);
				return true;
			}
		}
		else if (read (STDIN_FILENO, &k, 1) == 1)
		{
			// Check input on stdin
			if (k == 'q' || k == 'Q')
			{
				fprintf (stderr, "\nNetwork game synchronization aborted.");
				return false;
			}
		}
	}
}